

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_AigerWriteLut(Gia_Man_t *p,char *pFileName)

{
  uint *puVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 *__ptr;
  Vec_Wrd_t *vTruths;
  word *__s;
  word wVar10;
  FILE *__s_00;
  int iVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  undefined4 *puVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  
  iVar6 = Gia_ManLutSizeMax(p);
  iVar11 = 1 << ((char)iVar6 - 5U & 0x1f);
  if (iVar6 < 6) {
    iVar11 = 1;
  }
  iVar8 = p->vCis->nSize;
  iVar9 = p->vCos->nSize;
  iVar7 = Gia_ManLutNum(p);
  iVar8 = iVar7 + iVar8 + iVar9 + 1;
  __ptr = (undefined4 *)calloc((long)iVar8,0x54);
  uVar15 = p->nObjs;
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  uVar19 = 0x10;
  if (0xe < uVar15 - 1) {
    uVar19 = uVar15;
  }
  vTruths->nSize = 0;
  vTruths->nCap = uVar19;
  if (uVar19 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)(int)uVar19 << 3);
  }
  vTruths->pArray = __s;
  vTruths->nSize = uVar15;
  memset(__s,0,(long)(int)uVar15 << 3);
  if (6 < iVar6) {
    __assert_fail("LutSizeMax <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaUtil.c"
                  ,0x7fd,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
  }
  *__ptr = 3;
  sVar12 = (long)iVar11 << 2;
  memset(__ptr + 0xd,0xff,sVar12);
  if (0 < (int)uVar15) {
    pGVar3 = p->pObjs;
    lVar13 = 0;
    do {
      *(undefined4 *)((long)&pGVar3->Value + lVar13) = 0xffffffff;
      lVar13 = lVar13 + 0xc;
    } while ((ulong)uVar15 * 0xc != lVar13);
  }
  __ptr[1] = 0;
  pGVar3 = p->pObjs;
  pGVar3->Value = 0;
  iVar11 = p->vCis->nSize;
  if ((long)iVar11 < 1) {
    iVar11 = 1;
  }
  else {
    piVar4 = p->vCis->pArray;
    uVar19 = 2;
    lVar13 = 0;
    puVar16 = __ptr;
    do {
      iVar6 = piVar4[lVar13];
      if (((long)iVar6 < 0) || ((int)uVar15 <= iVar6)) goto LAB_00246c81;
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        iVar11 = (int)lVar13;
        break;
      }
      puVar16[0x15] = 1;
      memset(puVar16 + 0x22,0xaa,sVar12);
      puVar16[0x16] = uVar19;
      pGVar3[iVar6].Value = uVar19;
      lVar13 = lVar13 + 1;
      uVar19 = uVar19 + 2;
      puVar16 = puVar16 + 0x15;
    } while (iVar11 != lVar13);
    iVar11 = iVar11 + 1;
  }
  uVar15 = p->nObjs;
  uVar14 = (ulong)uVar15;
  if (0 < (int)uVar15) {
    lVar13 = 0;
    do {
      uVar15 = (uint)uVar14;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (lVar13 != 0) {
        iVar6 = p->vMapping->nSize;
        if (iVar6 <= lVar13) {
LAB_00246ca0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar4 = p->vMapping->pArray;
        uVar19 = piVar4[lVar13];
        if ((ulong)uVar19 != 0) {
          lVar17 = (long)iVar11;
          __ptr[lVar17 * 0x15] = 3;
          if (iVar6 <= (int)uVar19 || (int)uVar19 < 0) goto LAB_00246ca0;
          puVar1 = (uint *)(piVar4 + uVar19);
          uVar2 = *puVar1;
          uVar14 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar14 = 0;
          }
          uVar18 = 0;
          while (uVar14 != uVar18) {
            uVar2 = puVar1[uVar18 + 1];
            if (((long)(int)uVar2 < 0) || ((int)uVar15 <= (int)uVar2)) goto LAB_00246c81;
            __ptr[lVar17 * 0x15 + uVar18 + 5] = pGVar3[(int)uVar2].Value;
            uVar18 = uVar18 + 1;
            if (iVar6 <= (int)uVar19 || (int)uVar19 < 0) goto LAB_00246ca0;
          }
          __ptr[lVar17 * 0x15 + 3] = (int)uVar18;
          wVar10 = Gia_LutComputeTruth6(p,(int)lVar13,vTruths);
          *(word *)(__ptr + lVar17 * 0x15 + 0xd) = wVar10;
          if (iVar11 < 0) goto LAB_00246cbf;
          __ptr[lVar17 * 0x15 + 1] = iVar11 * 2;
          pGVar3[lVar13].Value = iVar11 * 2;
          iVar11 = iVar11 + 1;
        }
      }
      lVar13 = lVar13 + 1;
      uVar15 = p->nObjs;
      uVar14 = (ulong)(int)uVar15;
    } while (lVar13 < (long)uVar14);
  }
  iVar6 = p->vCos->nSize;
  iVar9 = iVar11;
  if (0 < (long)iVar6) {
    piVar4 = p->vCos->pArray;
    iVar9 = iVar11 + iVar6;
    puVar16 = __ptr + (long)iVar11 * 0x15 + 0xd;
    uVar19 = iVar11 * 2;
    lVar13 = 0;
    do {
      iVar7 = piVar4[lVar13];
      if (((long)iVar7 < 0) || ((int)uVar15 <= iVar7)) {
LAB_00246c81:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        iVar9 = iVar11 + (int)lVar13;
        break;
      }
      pGVar3 = p->pObjs + iVar7;
      puVar16[-0xd] = 2;
      uVar5 = *(undefined8 *)pGVar3;
      uVar14 = (ulong)((uint)uVar5 & 0x1fffffff);
      puVar16[-8] = pGVar3[-uVar14].Value;
      if ((((uint)uVar5 >> 0x1d & 1) == 0) ==
          ((~*(ulong *)(pGVar3 + -uVar14) & 0x1fffffff1fffffff) == 0)) {
        iVar7 = 0x55;
      }
      else {
        iVar7 = 0xaa;
      }
      memset(puVar16,iVar7,sVar12);
      puVar16[-10] = 1;
      if (iVar11 < 0) {
LAB_00246cbf:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      puVar16[-0xc] = uVar19;
      pGVar3->Value = uVar19;
      lVar13 = lVar13 + 1;
      puVar16 = puVar16 + 0x15;
      uVar19 = uVar19 + 2;
    } while (iVar6 != lVar13);
  }
  if (iVar9 != iVar8) {
    __assert_fail("iLut == nLuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaUtil.c"
                  ,0x826,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
  }
  __s_00 = fopen(pFileName,"wb");
  if (__s_00 == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    uVar15 = iVar8 * 0x54;
    sVar12 = fwrite(__ptr,1,(long)(int)uVar15,__s_00);
    if (uVar15 != (uint)sVar12) {
      __assert_fail("nSize1 == nSize2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaUtil.c"
                    ,0x830,"void Gia_AigerWriteLut(Gia_Man_t *, char *)");
    }
    printf("Successfully dumped %d bytes of binary data.\n",(ulong)uVar15);
  }
  fclose(__s_00);
  free(__ptr);
  if (vTruths->pArray != (word *)0x0) {
    free(vTruths->pArray);
    vTruths->pArray = (word *)0x0;
  }
  free(vTruths);
  return;
}

Assistant:

void Gia_AigerWriteLut( Gia_Man_t * p, char * pFileName )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, iLut = 0;
    int LutSizeMax = Gia_ManLutSizeMax( p );
    int nUints = Abc_TruthWordNum(LutSizeMax);
    int nLuts = 1 + Gia_ManCiNum(p) + Gia_ManCoNum(p) + Gia_ManLutNum(p);
    Gia_MapLut_t * pLuts = ABC_CALLOC( Gia_MapLut_t, nLuts );
    Vec_Wrd_t * vTruths = Vec_WrdStart( Gia_ManObjNum(p) );
    assert( LutSizeMax <= 6 );
    // set obj numbers
    // constant
    pLuts->Type = 3;
    memset( pLuts->pTruth, 0xFF, sizeof(unsigned) * nUints );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
    iLut++;
    // inputs
    Gia_ManForEachCi( p, pObj, i )
    {
        pLuts[iLut].Type = 1;
        memset( pLuts[iLut].pTruth, 0xAA, sizeof(unsigned) * nUints );
        pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
        iLut++;
    }
    // nodes
    Gia_ManForEachObj( p, pObj, i )
        if ( i && Gia_ObjIsLut(p, i) )
        {
            pLuts[iLut].Type = 3;
            Gia_LutForEachFanin( p, i, iFan, k )
                pLuts[iLut].pFans[k] = Gia_ManObj(p, iFan)->Value;
            pLuts[iLut].nFans = k;
            *(word *)pLuts[iLut].pTruth = Gia_LutComputeTruth6(p, i, vTruths);
            pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
            iLut++;
        }
    // outputs
    Gia_ManForEachCo( p, pObj, i )
    {
        pLuts[iLut].Type = 2;
        pLuts[iLut].pFans[0] = Gia_ObjFanin0(pObj)->Value;
        if ( Gia_ObjFaninC0(pObj) ^ Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            memset( pLuts[iLut].pTruth, 0x55, sizeof(unsigned) * nUints );
        else
            memset( pLuts[iLut].pTruth, 0xAA, sizeof(unsigned) * nUints );
        pLuts[iLut].nFans = 1;
        pObj->Value = pLuts[iLut].Out = Abc_Var2Lit( iLut, 0 );
        iLut++;
    }
    assert( iLut == nLuts );
    // dump into a file
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            int nSize1 = nLuts * sizeof(Gia_MapLut_t);
            int nSize2 = fwrite( pLuts, 1, nSize1, pFile );
            assert( nSize1 == nSize2 );
            printf( "Successfully dumped %d bytes of binary data.\n", nSize1 );
        }
        fclose( pFile );
    }
    ABC_FREE( pLuts );
    Vec_WrdFree( vTruths );
}